

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_install_compiler_options(spvc_compiler compiler,spvc_compiler_options options)

{
  char *pcVar1;
  spvc_backend sVar2;
  Compiler *pCVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  
  sVar2 = compiler->backend;
  if (sVar2 == SPVC_BACKEND_MSL) {
    pCVar3 = (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34) =
         (options->glsl).fragment;
    uVar5 = *(undefined8 *)&options->glsl;
    uVar6 = *(undefined8 *)&(options->glsl).force_recompile_max_debug_iterations;
    bVar8 = (options->glsl).emit_uniform_buffer_as_plain_uniforms;
    bVar9 = (options->glsl).emit_line_directives;
    bVar10 = (options->glsl).enable_storage_image_qualifier_deduction;
    bVar11 = (options->glsl).force_zero_initialized_variables;
    bVar12 = (options->glsl).force_flattened_io_blocks;
    bVar13 = (options->glsl).relax_nan_checks;
    bVar14 = (options->glsl).enable_row_major_load_workaround;
    uVar7 = *(undefined8 *)&(options->glsl).ovr_multiview_view_count;
    pcVar1 = (char *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
    pcVar1[0] = (options->glsl).emit_push_constant_as_uniform_buffer;
    pcVar1[1] = bVar8;
    pcVar1[2] = bVar9;
    pcVar1[3] = bVar10;
    pcVar1[4] = bVar11;
    pcVar1[5] = bVar12;
    pcVar1[6] = bVar13;
    pcVar1[7] = bVar14;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c) = uVar7;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14) = uVar5;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c) = uVar6;
    memcpy((size_t *)
           ((long)(compiler->compiler)._M_t.
                  super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                  .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl[3].ir.
                  ids_for_type + 0xb0),&options->msl,0x89);
  }
  else if (sVar2 == SPVC_BACKEND_HLSL) {
    pCVar3 = (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34) =
         (options->glsl).fragment;
    uVar5 = *(undefined8 *)&options->glsl;
    uVar6 = *(undefined8 *)&(options->glsl).force_recompile_max_debug_iterations;
    bVar8 = (options->glsl).emit_uniform_buffer_as_plain_uniforms;
    bVar9 = (options->glsl).emit_line_directives;
    bVar10 = (options->glsl).enable_storage_image_qualifier_deduction;
    bVar11 = (options->glsl).force_zero_initialized_variables;
    bVar12 = (options->glsl).force_flattened_io_blocks;
    bVar13 = (options->glsl).relax_nan_checks;
    bVar14 = (options->glsl).enable_row_major_load_workaround;
    uVar7 = *(undefined8 *)&(options->glsl).ovr_multiview_view_count;
    pcVar1 = (char *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
    pcVar1[0] = (options->glsl).emit_push_constant_as_uniform_buffer;
    pcVar1[1] = bVar8;
    pcVar1[2] = bVar9;
    pcVar1[3] = bVar10;
    pcVar1[4] = bVar11;
    pcVar1[5] = bVar12;
    pcVar1[6] = bVar13;
    pcVar1[7] = bVar14;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c) = uVar7;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14) = uVar5;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c) = uVar6;
    pCVar3 = (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    sVar4 = *(size_t *)&options->hlsl;
    *(undefined8 *)((long)pCVar3[3].ir.ids_for_type + 0xd) =
         *(undefined8 *)&(options->hlsl).point_coord_compat;
    *(size_t *)((long)pCVar3[3].ir.ids_for_type + 8) = sVar4;
  }
  else if (sVar2 == SPVC_BACKEND_GLSL) {
    pCVar3 = (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    *(FragmentOptions *)((long)&pCVar3[2].ir.declared_capabilities + 0x34) =
         (options->glsl).fragment;
    uVar5 = *(undefined8 *)&options->glsl;
    uVar6 = *(undefined8 *)&(options->glsl).force_recompile_max_debug_iterations;
    bVar8 = (options->glsl).emit_uniform_buffer_as_plain_uniforms;
    bVar9 = (options->glsl).emit_line_directives;
    bVar10 = (options->glsl).enable_storage_image_qualifier_deduction;
    bVar11 = (options->glsl).force_zero_initialized_variables;
    bVar12 = (options->glsl).force_flattened_io_blocks;
    bVar13 = (options->glsl).relax_nan_checks;
    bVar14 = (options->glsl).enable_row_major_load_workaround;
    uVar7 = *(undefined8 *)&(options->glsl).ovr_multiview_view_count;
    pcVar1 = (char *)((long)&pCVar3[2].ir.declared_capabilities + 0x24);
    pcVar1[0] = (options->glsl).emit_push_constant_as_uniform_buffer;
    pcVar1[1] = bVar8;
    pcVar1[2] = bVar9;
    pcVar1[3] = bVar10;
    pcVar1[4] = bVar11;
    pcVar1[5] = bVar12;
    pcVar1[6] = bVar13;
    pcVar1[7] = bVar14;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x2c) = uVar7;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x14) = uVar5;
    *(undefined8 *)((long)&pCVar3[2].ir.declared_capabilities + 0x1c) = uVar6;
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_install_compiler_options(spvc_compiler compiler, spvc_compiler_options options)
{
	(void)options;
	switch (compiler->backend)
	{
#if SPIRV_CROSS_C_API_GLSL
	case SPVC_BACKEND_GLSL:
		static_cast<CompilerGLSL &>(*compiler->compiler).set_common_options(options->glsl);
		break;
#endif

#if SPIRV_CROSS_C_API_HLSL
	case SPVC_BACKEND_HLSL:
		static_cast<CompilerHLSL &>(*compiler->compiler).set_common_options(options->glsl);
		static_cast<CompilerHLSL &>(*compiler->compiler).set_hlsl_options(options->hlsl);
		break;
#endif

#if SPIRV_CROSS_C_API_MSL
	case SPVC_BACKEND_MSL:
		static_cast<CompilerMSL &>(*compiler->compiler).set_common_options(options->glsl);
		static_cast<CompilerMSL &>(*compiler->compiler).set_msl_options(options->msl);
		break;
#endif

	default:
		break;
	}

	return SPVC_SUCCESS;
}